

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void regenerateSpherePositions(void)

{
  code *pcVar1;
  float fVar2;
  float fVar3;
  size_type __n;
  reference this;
  long lVar4;
  tvec3<float> *ptVar5;
  double dVar6;
  float local_54;
  float local_48;
  tvec3<float> local_44;
  float local_38;
  float local_34;
  float z;
  float x;
  float theta;
  int theta_i;
  float r;
  float y;
  float phi;
  int phi_i;
  size_t n;
  Perf stat;
  
  Perf::Perf((Perf *)((long)&n + 7),"Regenerate Sphere positions");
  std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::resize
            (&sphere_positions,(ulong)(uint)(((int)phi_n + 1) * ((int)theta_n + 1)));
  _phi = 0;
  for (y = 0.0; (ulong)(long)(int)y <= phi_n; y = (float)((int)y + 1)) {
    local_48 = (float)phi_n;
    r = ((float)(int)y * 3.1415927) / local_48;
    dVar6 = std::cos((double)(ulong)(uint)r);
    theta_i = SUB84(dVar6,0) ^ 0x80000000;
    dVar6 = std::sin((double)(ulong)(uint)r);
    theta = SUB84(dVar6,0);
    for (x = 0.0; fVar2 = theta, (ulong)(long)(int)x <= theta_n; x = (float)((int)x + 1)) {
      local_54 = (float)theta_n;
      z = ((float)(int)x * 6.2831855) / local_54;
      dVar6 = std::sin((double)(ulong)(uint)z);
      fVar3 = theta;
      local_34 = fVar2 * SUB84(dVar6,0);
      dVar6 = std::cos((double)(ulong)(uint)z);
      local_38 = fVar3 * SUB84(dVar6,0);
      glm::detail::tvec3<float>::tvec3(&local_44,&local_34,(value_type *)&theta_i,&local_38);
      __n = _phi;
      _phi = _phi + 1;
      this = std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::
             operator[](&sphere_positions,__n);
      glm::detail::tvec3<float>::operator=(this,&local_44);
    }
  }
  vertex_count = _phi;
  (*__glewBindBuffer)(0x8892,sphere_buffer);
  pcVar1 = __glewBufferData;
  lVar4 = _phi * 0xc;
  ptVar5 = std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::data
                     (&sphere_positions);
  (*pcVar1)(0x8892,lVar4,ptVar5,0x88e4);
  return;
}

Assistant:

void regenerateSpherePositions() {
    Perf stat("Regenerate Sphere positions");
    sphere_positions.resize(uint((phi_n + 1) * (theta_n + 1)));
    size_t n = 0;
    for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
        float phi = float(M_PI) * phi_i / phi_n;
        float y = -cos(phi);
        float r = sin(phi); // cylindrical radius

        for (int theta_i = 0; theta_i <= theta_n; theta_i++) {
            float theta = float(M_PI) * 2 * theta_i / theta_n;
            float x = r * sin(theta);
            float z = r * cos(theta);
            sphere_positions[n++] = vec3(x, y, z);
        }
    }

    vertex_count = n;

    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    glBufferData(GL_ARRAY_BUFFER, n * sizeof(vec3), sphere_positions.data(), GL_STATIC_DRAW);
}